

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

SmallVector<spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
spirv_cross::Compiler::get_case_list(Compiler *this,SPIRBlock *block)

{
  uint uVar1;
  Variant *pVVar2;
  SPIRConstant *pSVar3;
  SPIRConstantOp *pSVar4;
  SPIRType *pSVar5;
  __node_base_ptr p_Var6;
  uint32_t *puVar7;
  CompilerError *this_00;
  ulong __code;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *pSVar8;
  
  __code = (ulong)(block->condition).id;
  if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= __code) {
LAB_00384a86:
    p_Var6 = ::std::
             _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->ir).load_type_width._M_h,
                        __code % (this->ir).load_type_width._M_h._M_bucket_count,&block->condition,
                        __code);
    if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Use of undeclared variable on a switch statement.");
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar7 = (uint32_t *)((long)&p_Var6->_M_nxt[1]._M_nxt + 4);
    goto LAB_00384ab9;
  }
  pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar2[__code].type == TypeConstant) {
    pSVar3 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + __code);
LAB_00384a27:
    uVar1 = *(uint *)&(pSVar3->super_IVariant).field_0xc;
  }
  else {
    pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
    if (pVVar2[__code].type != TypeConstantOp) {
      pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar2[__code].type == TypeVariable) {
        pSVar3 = (SPIRConstant *)Variant::get<spirv_cross::SPIRVariable>(pVVar2 + __code);
      }
      else {
        pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[__code].type != TypeUndef) goto LAB_00384a86;
        pSVar3 = (SPIRConstant *)Variant::get<spirv_cross::SPIRUndef>(pVVar2 + __code);
      }
      goto LAB_00384a27;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar2 + __code);
    uVar1 = (pSVar4->basetype).id;
  }
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar1);
  puVar7 = &pSVar5->width;
LAB_00384ab9:
  pSVar8 = &block->cases_64bit;
  if (*puVar7 < 0x21) {
    pSVar8 = &block->cases_32bit;
  }
  return pSVar8;
}

Assistant:

const SmallVector<SPIRBlock::Case> &Compiler::get_case_list(const SPIRBlock &block) const
{
	uint32_t width = 0;

	// First we check if we can get the type directly from the block.condition
	// since it can be a SPIRConstant or a SPIRVariable.
	if (const auto *constant = maybe_get<SPIRConstant>(block.condition))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		width = type.width;
	}
	else if (const auto *op = maybe_get<SPIRConstantOp>(block.condition))
	{
		const auto &type = get<SPIRType>(op->basetype);
		width = type.width;
	}
	else if (const auto *var = maybe_get<SPIRVariable>(block.condition))
	{
		const auto &type = get<SPIRType>(var->basetype);
		width = type.width;
	}
	else if (const auto *undef = maybe_get<SPIRUndef>(block.condition))
	{
		const auto &type = get<SPIRType>(undef->basetype);
		width = type.width;
	}
	else
	{
		auto search = ir.load_type_width.find(block.condition);
		if (search == ir.load_type_width.end())
		{
			SPIRV_CROSS_THROW("Use of undeclared variable on a switch statement.");
		}

		width = search->second;
	}

	if (width > 32)
		return block.cases_64bit;

	return block.cases_32bit;
}